

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O1

objnum objget1sc(mcmcxdef *ctx,objnum objn)

{
  uchar *puVar1;
  objnum oVar2;
  
  puVar1 = mcmlck(ctx,objn);
  if (*(short *)(puVar1 + 4) == 0) {
    oVar2 = 0xffff;
  }
  else {
    oVar2 = *(objnum *)(puVar1 + 0xe);
  }
  mcmunlck(ctx,objn);
  return oVar2;
}

Assistant:

objnum objget1sc(mcmcxdef *ctx, objnum objn)
{
    objdef *p;
    objnum  retval;

    /* lock the object */
    p = mcmlck(ctx, (mcmon)objn);

    /* get the first superclass if it has any */
    if (objnsc(p) == 0)
        retval = MCMONINV;
    else
        retval = osrp2(objsc(p));

    /* unlock the object and return the superclass value */
    mcmunlck(ctx, (mcmon)objn);
    return retval;
}